

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O0

DdNode * Cudd_addNonSimCompose(DdManager *dd,DdNode *f,DdNode **vector)

{
  uint lastsub_00;
  int iVar1;
  ulong uVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *g;
  uint local_60;
  uint local_5c;
  int lastsub;
  int i;
  DdNode *res;
  DdNode *piece;
  DdNode *tmp;
  DdNode *var;
  DdNode *key;
  DdNode *cube;
  DdNode **vector_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  var = dd->one;
  uVar2 = (ulong)var & 0xfffffffffffffffe;
  *(int *)(uVar2 + 4) = *(int *)(uVar2 + 4) + 1;
  key = dd->one;
  uVar2 = (ulong)key & 0xfffffffffffffffe;
  *(int *)(uVar2 + 4) = *(int *)(uVar2 + 4) + 1;
  local_5c = dd->size;
  while (local_5c = local_5c - 1, -1 < (int)local_5c) {
    iVar1 = ddIsIthAddVar(dd,vector[(int)local_5c],local_5c);
    if (iVar1 == 0) {
      pDVar3 = Cudd_addIthVar(dd,local_5c);
      if (pDVar3 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,var);
        Cudd_RecursiveDeref(dd,key);
        return (DdNode *)0x0;
      }
      *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
      pDVar4 = Cudd_addApply(dd,Cudd_addTimes,pDVar3,key);
      if (pDVar4 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,var);
        Cudd_RecursiveDeref(dd,key);
        Cudd_RecursiveDeref(dd,pDVar3);
        return (DdNode *)0x0;
      }
      *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) + 1;
      Cudd_RecursiveDeref(dd,key);
      g = Cudd_addApply(dd,Cudd_addXnor,pDVar3,vector[(int)local_5c]);
      if (g == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,var);
        Cudd_RecursiveDeref(dd,pDVar3);
        return (DdNode *)0x0;
      }
      *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)g & 0xfffffffffffffffe) + 4) + 1;
      Cudd_RecursiveDeref(dd,pDVar3);
      pDVar3 = Cudd_addApply(dd,Cudd_addTimes,var,g);
      if (pDVar3 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,var);
        Cudd_RecursiveDeref(dd,g);
        return (DdNode *)0x0;
      }
      *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
      Cudd_RecursiveDeref(dd,var);
      Cudd_RecursiveDeref(dd,g);
      var = pDVar3;
      key = pDVar4;
    }
  }
  do {
    local_60 = dd->size;
    do {
      lastsub_00 = local_60;
      local_60 = lastsub_00 - 1;
      if ((int)local_60 < 0) break;
      iVar1 = ddIsIthAddVar(dd,vector[(int)local_60],local_60);
    } while (iVar1 != 0);
    dd->reordered = 0;
    pDVar3 = cuddAddNonSimComposeRecur(dd,f,vector,var,key,lastsub_00);
    if (pDVar3 != (DdNode *)0x0) {
      *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
    }
    if (dd->reordered != 1) {
      Cudd_RecursiveDeref(dd,var);
      Cudd_RecursiveDeref(dd,key);
      if (pDVar3 != (DdNode *)0x0) {
        *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + -1;
      }
      return pDVar3;
    }
  } while( true );
}

Assistant:

DdNode *
Cudd_addNonSimCompose(
  DdManager * dd,
  DdNode * f,
  DdNode ** vector)
{
    DdNode              *cube, *key, *var, *tmp, *piece;
    DdNode              *res;
    int                 i, lastsub;

    /* The cache entry for this function is composed of three parts:
    ** f itself, the replacement relation, and the cube of the
    ** variables being substituted.
    ** The replacement relation is the product of the terms (yi EXNOR gi).
    ** This apporach allows us to use the global cache for this function,
    ** with great savings in memory with respect to using arrays for the
    ** cache entries.
    ** First we build replacement relation and cube of substituted
    ** variables from the vector specifying the desired composition.
    */
    key = DD_ONE(dd);
    cuddRef(key);
    cube = DD_ONE(dd);
    cuddRef(cube);
    for (i = (int) dd->size - 1; i >= 0; i--) {
        if (ddIsIthAddVar(dd,vector[i],(unsigned int)i)) {
            continue;
        }
        var = Cudd_addIthVar(dd,i);
        if (var == NULL) {
            Cudd_RecursiveDeref(dd,key);
            Cudd_RecursiveDeref(dd,cube);
            return(NULL);
        }
        cuddRef(var);
        /* Update cube. */
        tmp = Cudd_addApply(dd,Cudd_addTimes,var,cube);
        if (tmp == NULL) {
            Cudd_RecursiveDeref(dd,key);
            Cudd_RecursiveDeref(dd,cube);
            Cudd_RecursiveDeref(dd,var);
            return(NULL);
        }
        cuddRef(tmp);
        Cudd_RecursiveDeref(dd,cube);
        cube = tmp;
        /* Update replacement relation. */
        piece = Cudd_addApply(dd,Cudd_addXnor,var,vector[i]);
        if (piece == NULL) {
            Cudd_RecursiveDeref(dd,key);
            Cudd_RecursiveDeref(dd,var);
            return(NULL);
        }
        cuddRef(piece);
        Cudd_RecursiveDeref(dd,var);
        tmp = Cudd_addApply(dd,Cudd_addTimes,key,piece);
        if (tmp == NULL) {
            Cudd_RecursiveDeref(dd,key);
            Cudd_RecursiveDeref(dd,piece);
            return(NULL);
        }
        cuddRef(tmp);
        Cudd_RecursiveDeref(dd,key);
        Cudd_RecursiveDeref(dd,piece);
        key = tmp;
    }

    /* Now try composition, until no reordering occurs. */
    do {
        /* Find real substitution with largest index. */
        for (lastsub = dd->size - 1; lastsub >= 0; lastsub--) {
            if (!ddIsIthAddVar(dd,vector[lastsub],(unsigned int)lastsub)) {
                break;
            }
        }

        /* Recursively solve the problem. */
        dd->reordered = 0;
        res = cuddAddNonSimComposeRecur(dd,f,vector,key,cube,lastsub+1);
        if (res != NULL) cuddRef(res);

    } while (dd->reordered == 1);

    Cudd_RecursiveDeref(dd,key);
    Cudd_RecursiveDeref(dd,cube);
    if (res != NULL) cuddDeref(res);
    return(res);

}